

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::GroupBinder::BindConstant
          (BindResult *__return_storage_ptr__,GroupBinder *this,ConstantExpression *constant)

{
  bool bVar1;
  int64_t iVar2;
  
  bVar1 = LogicalType::IsIntegral(&(constant->value).type_);
  if (bVar1) {
    iVar2 = Value::GetValue<long>(&constant->value);
    BindSelectRef(__return_storage_ptr__,this,iVar2 - 1);
  }
  else {
    ExpressionBinder::BindExpression
              (__return_storage_ptr__,&this->super_ExpressionBinder,constant,0);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult GroupBinder::BindConstant(ConstantExpression &constant) {
	// constant as root expression
	if (!constant.value.type().IsIntegral()) {
		// non-integral expression, we just leave the constant here.
		return ExpressionBinder::BindExpression(constant, 0);
	}
	// INTEGER constant: we use the integer as an index into the select list (e.g. GROUP BY 1)
	auto index = (idx_t)constant.value.GetValue<int64_t>();
	return BindSelectRef(index - 1);
}